

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_render_channels.cpp
# Opt level: O1

void __thiscall
ON_RenderChannels::GetCustomList(ON_RenderChannels *this,ON_SimpleArray<ON_UUID_struct> *chan)

{
  ON_InternalXMLImpl *this_00;
  int iVar1;
  wchar_t *pwVar2;
  ON_wString s;
  ON_UUID uuid;
  undefined1 auStack_228 [8];
  ON_XMLVariant local_220;
  ON_XMLVariant local_128;
  
  this_00 = &this->m_impl->super_ON_InternalXMLImpl;
  ::ON_XMLVariant::ON_XMLVariant(&local_128,false);
  ON_InternalXMLImpl::GetParameter
            (&local_220,this_00,
             L"render-content-manager-document/settings/rendering/render-channels",L"list",
             &local_128);
  ::ON_XMLVariant::AsString((ON_XMLVariant *)auStack_228);
  ::ON_XMLVariant::~ON_XMLVariant(&local_220);
  ::ON_XMLVariant::~ON_XMLVariant(&local_128);
  iVar1 = ON_wString::Length((ON_wString *)auStack_228);
  if (iVar1 != 0) {
    pwVar2 = ON_wString::operator[]((ON_wString *)auStack_228,iVar1 + -1);
    if (*pwVar2 != L';') {
      ON_wString::operator+=((ON_wString *)auStack_228,L';');
    }
    while( true ) {
      iVar1 = ON_wString::Find((ON_wString *)auStack_228,L";");
      if (iVar1 < 0) break;
      ON_wString::Left((ON_wString *)&local_128,(int)auStack_228);
      pwVar2 = ON_wString::operator_cast_to_wchar_t_((ON_wString *)&local_128);
      local_220._0_16_ = ON_UuidFromString(pwVar2);
      ON_wString::~ON_wString((ON_wString *)&local_128);
      ON_SimpleArray<ON_UUID_struct>::Append(chan,(ON_UUID_struct *)&local_220);
      ON_wString::Mid((ON_wString *)&local_128,(int)auStack_228);
      ON_wString::operator=((ON_wString *)auStack_228,(ON_wString *)&local_128);
      ON_wString::~ON_wString((ON_wString *)&local_128);
    }
  }
  ON_wString::~ON_wString((ON_wString *)auStack_228);
  return;
}

Assistant:

void ON_RenderChannels::GetCustomList(ON_SimpleArray<ON_UUID>& chan) const
{
  ON_wString s = m_impl->GetParameter(XMLPath(), ON_RDK_RCH_LIST, false).AsString();
  const int len = s.Length();
  if (len == 0)
    return;

  if (s[len-1] != L';')
    s += L';';

  int pos = -1;
  while ((pos = s.Find(L";")) >= 0)
  {
    const ON_UUID uuid = ON_UuidFromString(s.Left(pos));
    chan.Append(uuid);
    s = s.Mid(pos+1);
  }
}